

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O1

void __thiscall
CGraphics_Threaded::QuadsDrawFreeform(CGraphics_Threaded *this,CFreeformItem *pArray,int Num)

{
  CColor *pCVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/client/graphics_threaded.cpp"
                 ,0x29f,(uint)(this->m_Drawing == 1),
                 "called Graphics()->QuadsDrawFreeform without begin");
  if (0 < Num) {
    lVar7 = 0;
    do {
      iVar6 = this->m_NumVertices;
      iVar2 = (int)lVar7;
      iVar8 = iVar2 + iVar6;
      this->m_aVertices[iVar8].m_Pos = *(CPoint *)(&pArray->m_X0 + lVar7 * 2);
      this->m_aVertices[iVar8].m_Tex.i = this->m_aTexture[0].i;
      fVar3 = this->m_aTexture[0].v;
      this->m_aVertices[iVar8].m_Tex.u = this->m_aTexture[0].u;
      this->m_aVertices[iVar8].m_Tex.v = fVar3;
      fVar3 = this->m_aColor[0].g;
      fVar4 = this->m_aColor[0].b;
      fVar5 = this->m_aColor[0].a;
      pCVar1 = &this->m_aVertices[iVar8].m_Color;
      pCVar1->r = this->m_aColor[0].r;
      pCVar1->g = fVar3;
      pCVar1->b = fVar4;
      pCVar1->a = fVar5;
      iVar6 = iVar2 + 1 + iVar6;
      this->m_aVertices[iVar6].m_Pos = *(CPoint *)(&pArray->m_X1 + lVar7 * 2);
      fVar3 = this->m_aTexture[1].v;
      this->m_aVertices[iVar6].m_Tex.u = this->m_aTexture[1].u;
      this->m_aVertices[iVar6].m_Tex.v = fVar3;
      this->m_aVertices[iVar6].m_Tex.i = this->m_aTexture[1].i;
      fVar3 = this->m_aColor[1].g;
      fVar4 = this->m_aColor[1].b;
      fVar5 = this->m_aColor[1].a;
      pCVar1 = &this->m_aVertices[iVar2 + 1 + this->m_NumVertices].m_Color;
      pCVar1->r = this->m_aColor[1].r;
      pCVar1->g = fVar3;
      pCVar1->b = fVar4;
      pCVar1->a = fVar5;
      iVar6 = iVar2 + 2 + this->m_NumVertices;
      this->m_aVertices[iVar6].m_Pos = *(CPoint *)(&pArray->m_X3 + lVar7 * 2);
      fVar3 = this->m_aTexture[3].v;
      this->m_aVertices[iVar6].m_Tex.u = this->m_aTexture[3].u;
      this->m_aVertices[iVar6].m_Tex.v = fVar3;
      this->m_aVertices[iVar6].m_Tex.i = this->m_aTexture[3].i;
      fVar3 = this->m_aColor[3].g;
      fVar4 = this->m_aColor[3].b;
      fVar5 = this->m_aColor[3].a;
      pCVar1 = &this->m_aVertices[iVar2 + 2 + this->m_NumVertices].m_Color;
      pCVar1->r = this->m_aColor[3].r;
      pCVar1->g = fVar3;
      pCVar1->b = fVar4;
      pCVar1->a = fVar5;
      iVar6 = iVar2 + 3 + this->m_NumVertices;
      this->m_aVertices[iVar6].m_Pos = *(CPoint *)(&pArray->m_X2 + lVar7 * 2);
      fVar3 = this->m_aTexture[2].v;
      this->m_aVertices[iVar6].m_Tex.u = this->m_aTexture[2].u;
      this->m_aVertices[iVar6].m_Tex.v = fVar3;
      this->m_aVertices[iVar6].m_Tex.i = this->m_aTexture[2].i;
      fVar3 = this->m_aColor[2].g;
      fVar4 = this->m_aColor[2].b;
      fVar5 = this->m_aColor[2].a;
      pCVar1 = &this->m_aVertices[iVar2 + 3 + this->m_NumVertices].m_Color;
      pCVar1->r = this->m_aColor[2].r;
      pCVar1->g = fVar3;
      pCVar1->b = fVar4;
      pCVar1->a = fVar5;
      lVar7 = lVar7 + 4;
    } while ((ulong)(uint)Num << 2 != lVar7);
  }
  iVar6 = Num * 4 + this->m_NumVertices;
  this->m_NumVertices = iVar6;
  if (0x7fff < iVar6 + Num * 4) {
    FlushVertices(this);
    return;
  }
  return;
}

Assistant:

void CGraphics_Threaded::QuadsDrawFreeform(const CFreeformItem *pArray, int Num)
{
	dbg_assert(m_Drawing == DRAWING_QUADS, "called Graphics()->QuadsDrawFreeform without begin");

	for(int i = 0; i < Num; ++i)
	{
		m_aVertices[m_NumVertices + 4*i].m_Pos.x = pArray[i].m_X0;
		m_aVertices[m_NumVertices + 4*i].m_Pos.y = pArray[i].m_Y0;
		m_aVertices[m_NumVertices + 4*i].m_Tex = m_aTexture[0];
		m_aVertices[m_NumVertices + 4*i].m_Color = m_aColor[0];

		m_aVertices[m_NumVertices + 4*i + 1].m_Pos.x = pArray[i].m_X1;
		m_aVertices[m_NumVertices + 4*i + 1].m_Pos.y = pArray[i].m_Y1;
		m_aVertices[m_NumVertices + 4*i + 1].m_Tex = m_aTexture[1];
		m_aVertices[m_NumVertices + 4*i + 1].m_Color = m_aColor[1];

		m_aVertices[m_NumVertices + 4*i + 2].m_Pos.x = pArray[i].m_X3;
		m_aVertices[m_NumVertices + 4*i + 2].m_Pos.y = pArray[i].m_Y3;
		m_aVertices[m_NumVertices + 4*i + 2].m_Tex = m_aTexture[3];
		m_aVertices[m_NumVertices + 4*i + 2].m_Color = m_aColor[3];

		m_aVertices[m_NumVertices + 4*i + 3].m_Pos.x = pArray[i].m_X2;
		m_aVertices[m_NumVertices + 4*i + 3].m_Pos.y = pArray[i].m_Y2;
		m_aVertices[m_NumVertices + 4*i + 3].m_Tex = m_aTexture[2];
		m_aVertices[m_NumVertices + 4*i + 3].m_Color = m_aColor[2];
	}

	AddVertices(4*Num);
}